

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

int Imf_3_4::numLinesInBuffer(Compression comp)

{
  int iVar1;
  int iVar2;
  ArgExc *this;
  
  iVar1 = getCompressionNumScanlines(comp);
  iVar2 = exr_compression_lines_per_chunk(comp);
  if (iVar2 == iVar1) {
    if (0 < iVar1) {
      return iVar1;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this,"Unknown compression type");
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this,"Mismatch in compression lines per chunk");
  }
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
numLinesInBuffer (Compression comp)
{
    int numScanlines = getCompressionNumScanlines (comp);
    if (exr_compression_lines_per_chunk ((exr_compression_t)comp) != numScanlines)
        throw IEX_NAMESPACE::ArgExc ("Mismatch in compression lines per chunk");
    if (numScanlines < 1)
        throw IEX_NAMESPACE::ArgExc ("Unknown compression type");
    return numScanlines;
}